

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampleMOD.cpp
# Opt level: O0

void __thiscall
WDL_Resampler::WDL_Resampler_Filter::ApplyIIRFade
          (WDL_Resampler_Filter *this,WDL_ResampleSample *out1,int ns,int span,double *hsave,
          double v0,double dv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double out;
  double in;
  double hist [4];
  double a2;
  double a1;
  double b2;
  double b1;
  double b0;
  double dv_local;
  double v0_local;
  double *hsave_local;
  int span_local;
  int ns_local;
  WDL_ResampleSample *out1_local;
  WDL_Resampler_Filter *this_local;
  
  dVar1 = this->m_b0;
  dVar2 = this->m_b1;
  dVar3 = this->m_b2;
  dVar4 = this->m_a1;
  dVar5 = this->m_a2;
  hist[0] = hsave[1];
  hist[1] = hsave[2];
  hist[2] = hsave[3];
  in = *hsave;
  dv_local = v0;
  hsave_local._4_4_ = ns;
  _span_local = out1;
  while (hsave_local._4_4_ != 0) {
    dVar7 = (double)*_span_local;
    dVar8 = hist[0] * dVar3;
    dVar6 = -hist[2];
    hist[0] = in;
    hist[2] = hist[1];
    hist[1] = denormal_filter_double
                        (dVar6 * dVar5 + -hist[1] * dVar4 + dVar8 + dVar7 * dVar1 + in * dVar2);
    *_span_local = (float)(hist[1] * dv_local + dVar7 * (1.0 - dv_local));
    dv_local = dv + dv_local;
    _span_local = _span_local + span;
    in = dVar7;
    hsave_local._4_4_ = hsave_local._4_4_ + -1;
  }
  *hsave = in;
  hsave[1] = hist[0];
  hsave[2] = hist[1];
  hsave[3] = hist[2];
  return;
}

Assistant:

void ApplyIIRFade(WDL_ResampleSample *out1, int ns, int span, double *hsave, double v0, double dv)
  {
    double b0=m_b0,b1=m_b1,b2=m_b2,a1=m_a1,a2=m_a2;
    double hist[4];
    memcpy(hist,hsave, sizeof(hist));
    while (ns--)
    {
      double in=*out1;
      double out = (double) ( in*b0 + hist[0]*b1 + hist[1]*b2 - hist[2]*a1 - hist[3]*a2);
      hist[1]=hist[0]; hist[0]=in;
      hist[3]=hist[2];
      *out1 = (hist[2] = denormal_filter_double(out)) * v0 + in * (1.0-v0);
      v0 += dv;
      out1+=span;
    }
    memcpy(hsave, hist, sizeof(hist));
  }